

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_build_certificate_message
              (ptls_buffer_t *buf,ptls_iovec_t context,ptls_iovec_t *certificates,
              size_t num_certificates,ptls_iovec_t ocsp_status)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 local_73;
  undefined2 local_72;
  size_t local_70;
  size_t local_68;
  uint8_t *local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  ptls_iovec_t *local_38;
  
  iVar1 = ptls_buffer__do_pushv(buf,"",1);
  if (iVar1 == 0) {
    sVar6 = buf->off;
    local_38 = certificates;
    iVar1 = ptls_buffer__do_pushv(buf,context.base,context.len);
    if (iVar1 == 0) {
      uVar2 = buf->off - sVar6;
      iVar1 = 0x20c;
      if (uVar2 < 0x100) {
        buf->base[sVar6 - 1] = (uint8_t)uVar2;
        iVar1 = ptls_buffer__do_pushv(buf,"",3);
        if (iVar1 == 0) {
          local_68 = buf->off;
          local_60 = ocsp_status.base;
          local_70 = ocsp_status.len;
          local_40 = num_certificates;
          for (sVar6 = 0; sVar6 != local_40; sVar6 = sVar6 + 1) {
            iVar1 = ptls_buffer__do_pushv(buf,"",3);
            if (iVar1 != 0) {
              return iVar1;
            }
            sVar5 = buf->off;
            iVar1 = ptls_buffer__do_pushv(buf,local_38[sVar6].base,local_38[sVar6].len);
            if (iVar1 != 0) {
              return iVar1;
            }
            uVar2 = buf->off - sVar5;
            if (0xffffff < uVar2) {
              return 0x20c;
            }
            for (lVar3 = 0x10; lVar3 != -8; lVar3 = lVar3 + -8) {
              buf->base[sVar5 - 3] = (uint8_t)(uVar2 >> ((byte)lVar3 & 0x3f));
              sVar5 = sVar5 + 1;
            }
            iVar1 = ptls_buffer__do_pushv(buf,"",2);
            if (iVar1 != 0) {
              return iVar1;
            }
            sVar5 = buf->off;
            sVar4 = sVar5;
            if (sVar6 == 0 && local_70 != 0) {
              local_72 = 0x500;
              local_50 = sVar5;
              local_48 = sVar6;
              iVar1 = ptls_buffer__do_pushv(buf,&local_72,2);
              if (iVar1 != 0) {
                return iVar1;
              }
              iVar1 = ptls_buffer__do_pushv(buf,"",2);
              if (iVar1 != 0) {
                return iVar1;
              }
              local_58 = buf->off;
              local_73 = 1;
              iVar1 = ptls_buffer__do_pushv(buf,&local_73,1);
              if (iVar1 != 0) {
                return iVar1;
              }
              iVar1 = ptls_buffer__do_pushv(buf,"",3);
              if (iVar1 != 0) {
                return iVar1;
              }
              sVar6 = buf->off;
              iVar1 = ptls_buffer__do_pushv(buf,local_60,local_70);
              if (iVar1 != 0) {
                return iVar1;
              }
              uVar2 = buf->off - sVar6;
              if (0xffffff < uVar2) {
                return 0x20c;
              }
              for (lVar3 = 0x10; lVar3 != -8; lVar3 = lVar3 + -8) {
                buf->base[sVar6 - 3] = (uint8_t)(uVar2 >> ((byte)lVar3 & 0x3f));
                sVar6 = sVar6 + 1;
              }
              uVar2 = buf->off - local_58;
              if (0xffff < uVar2) {
                return 0x20c;
              }
              buf->base[local_58 - 2] = (uint8_t)(uVar2 >> 8);
              buf->base[local_58 - 1] = (uint8_t)uVar2;
              sVar5 = buf->off;
              sVar4 = local_50;
              sVar6 = local_48;
            }
            uVar2 = sVar5 - sVar4;
            if (0xffff < uVar2) {
              return 0x20c;
            }
            buf->base[sVar4 - 2] = (uint8_t)(uVar2 >> 8);
            buf->base[sVar4 - 1] = (uint8_t)uVar2;
          }
          uVar2 = buf->off - local_68;
          iVar1 = 0x20c;
          if (uVar2 < 0x1000000) {
            for (lVar3 = 0x10; lVar3 != -8; lVar3 = lVar3 + -8) {
              buf->base[local_68 - 3] = (uint8_t)(uVar2 >> ((byte)lVar3 & 0x3f));
              local_68 = local_68 + 1;
            }
            iVar1 = 0;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int ptls_build_certificate_message(ptls_buffer_t *buf, ptls_iovec_t context, ptls_iovec_t *certificates, size_t num_certificates,
                                   ptls_iovec_t ocsp_status)
{
    int ret;

    ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, context.base, context.len); });
    ptls_buffer_push_block(buf, 3, {
        size_t i;
        for (i = 0; i != num_certificates; ++i) {
            ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, certificates[i].base, certificates[i].len); });
            ptls_buffer_push_block(buf, 2, {
                if (i == 0 && ocsp_status.len != 0) {
                    buffer_push_extension(buf, PTLS_EXTENSION_TYPE_STATUS_REQUEST, {
                        ptls_buffer_push(buf, 1); /* status_type == ocsp */
                        ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, ocsp_status.base, ocsp_status.len); });
                    });
                }
            });
        }
    });

    ret = 0;
Exit:
    return ret;
}